

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_59::InMemoryFile::zero(InMemoryFile *this,uint64_t offset,uint64_t zeroSize)

{
  bool bVar1;
  Impl *pIVar2;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar3;
  uchar *puVar4;
  Fault local_88;
  Fault f;
  undefined1 local_78 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  uint64_t end;
  undefined1 local_30 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  uint64_t zeroSize_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  if (zeroSize != 0) {
    lock.ptr = (Impl *)zeroSize;
    zeroSize_local = offset;
    offset_local = (uint64_t)this;
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30,&this->impl);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    Impl::modified(pIVar2);
    _kjCondition._32_8_ = (long)&(lock.ptr)->clock + zeroSize_local;
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (unsigned_long *)&_kjCondition.result);
    kj::_::DebugExpression<unsigned_long&>::operator>=
              ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_78,
               (DebugExpression<unsigned_long&> *)&f,&zeroSize_local);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[32]>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x355,FAILED,"end >= offset","_kjCondition,\"zero() request overflows uint64\"",
                 (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_78,
                 (char (*) [32])"zero() request overflows uint64");
      kj::_::Debug::Fault::fatal(&local_88);
    }
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    Impl::ensureCapacity(pIVar2,_kjCondition._32_8_);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    WVar3 = max<unsigned_long&,unsigned_long&>(&pIVar2->size,(unsigned_long *)&_kjCondition.result);
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    pIVar2->size = WVar3;
    pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
    puVar4 = Array<unsigned_char>::begin(&pIVar2->bytes);
    memset(puVar4 + zeroSize_local,0,(size_t)lock.ptr);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t zeroSize) const override {
    if (zeroSize == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + zeroSize;
    KJ_REQUIRE(end >= offset, "zero() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memset(lock->bytes.begin() + offset, 0, zeroSize);
  }